

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::fillWithRandomColorTiles
               (PixelBufferAccess *dst,Vec4 *minVal,Vec4 *maxVal,deUint32 seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  float fVar5;
  deUint32 local_a8;
  deUint32 local_a4;
  PixelBufferAccess local_a0;
  int local_78;
  undefined1 local_74 [4];
  int i;
  Vec4 color;
  int xEnd;
  int xBegin;
  int yEnd;
  int yBegin;
  int col;
  int row;
  int local_40;
  undefined1 local_3c [4];
  int slice;
  Random rnd;
  int numRows;
  int numCols;
  deUint32 seed_local;
  Vec4 *maxVal_local;
  Vec4 *minVal_local;
  PixelBufferAccess *dst_local;
  
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  if (iVar1 < 7) {
    local_a4 = tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  }
  else {
    local_a4 = 7;
  }
  rnd.m_rnd.w = local_a4;
  iVar1 = tcu::ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
  if (iVar1 < 5) {
    local_a8 = tcu::ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
  }
  else {
    local_a8 = 5;
  }
  rnd.m_rnd.z = local_a8;
  de::Random::Random((Random *)local_3c,seed);
  local_40 = 0;
  while( true ) {
    iVar1 = tcu::ConstPixelBufferAccess::getDepth(&dst->super_ConstPixelBufferAccess);
    if (iVar1 <= local_40) break;
    for (yBegin = 0; yBegin < (int)rnd.m_rnd.z; yBegin = yBegin + 1) {
      for (yEnd = 0; yEnd < (int)rnd.m_rnd.w; yEnd = yEnd + 1) {
        iVar1 = tcu::ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
        iVar1 = (yBegin * iVar1) / (int)rnd.m_rnd.z;
        iVar2 = tcu::ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
        iVar2 = ((yBegin + 1) * iVar2) / (int)rnd.m_rnd.z;
        iVar3 = tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
        color.m_data[3] = (float)((yEnd * iVar3) / (int)rnd.m_rnd.w);
        iVar3 = tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
        color.m_data[2] = (float)(((yEnd + 1) * iVar3) / (int)rnd.m_rnd.w);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_74);
        for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
          pfVar4 = tcu::Vector<float,_4>::operator[](minVal,local_78);
          fVar5 = *pfVar4;
          pfVar4 = tcu::Vector<float,_4>::operator[](maxVal,local_78);
          fVar5 = de::Random::getFloat((Random *)local_3c,fVar5,*pfVar4);
          pfVar4 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_74,local_78);
          *pfVar4 = fVar5;
        }
        tcu::getSubregion(&local_a0,dst,(int)color.m_data[3],iVar1,local_40,
                          (int)color.m_data[2] - (int)color.m_data[3],iVar2 - iVar1,1);
        tcu::clear(&local_a0,(Vec4 *)local_74);
      }
    }
    local_40 = local_40 + 1;
  }
  de::Random::~Random((Random *)local_3c);
  return;
}

Assistant:

static void fillWithRandomColorTiles (const PixelBufferAccess& dst, const Vec4& minVal, const Vec4& maxVal, deUint32 seed)
{
	const int	numCols		= dst.getWidth()  >= 7 ? 7 : dst.getWidth();
	const int	numRows		= dst.getHeight() >= 5 ? 5 : dst.getHeight();
	de::Random	rnd			(seed);

	for (int slice = 0; slice < dst.getDepth(); slice++)
	for (int row = 0; row < numRows; row++)
	for (int col = 0; col < numCols; col++)
	{
		const int	yBegin	= (row+0)*dst.getHeight()/numRows;
		const int	yEnd	= (row+1)*dst.getHeight()/numRows;
		const int	xBegin	= (col+0)*dst.getWidth()/numCols;
		const int	xEnd	= (col+1)*dst.getWidth()/numCols;
		Vec4		color;
		for (int i = 0; i < 4; i++)
			color[i] = rnd.getFloat(minVal[i], maxVal[i]);
		tcu::clear(tcu::getSubregion(dst, xBegin, yBegin, slice, xEnd-xBegin, yEnd-yBegin, 1), color);
	}
}